

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImStrTrimBlanks(char *buf)

{
  char *__src;
  bool bVar1;
  char *p_start;
  char *p;
  char *buf_local;
  
  p_start = buf;
  while( true ) {
    __src = p_start;
    bVar1 = true;
    if (*p_start != ' ') {
      bVar1 = *p_start == '\t';
    }
    if (!bVar1) break;
    p_start = p_start + 1;
  }
  for (; *p_start != '\0'; p_start = p_start + 1) {
  }
  while( true ) {
    bVar1 = false;
    if ((__src < p_start) && (bVar1 = true, p_start[-1] != ' ')) {
      bVar1 = p_start[-1] == '\t';
    }
    if (!bVar1) break;
    p_start = p_start + -1;
  }
  if (__src != buf) {
    memmove(buf,__src,(long)p_start - (long)__src);
  }
  buf[(long)p_start - (long)__src] = '\0';
  return;
}

Assistant:

void ImStrTrimBlanks(char* buf)
{
    char* p = buf;
    while (p[0] == ' ' || p[0] == '\t')     // Leading blanks
        p++;
    char* p_start = p;
    while (*p != 0)                         // Find end of string
        p++;
    while (p > p_start && (p[-1] == ' ' || p[-1] == '\t'))  // Trailing blanks
        p--;
    if (p_start != buf)                     // Copy memory if we had leading blanks
        memmove(buf, p_start, p - p_start);
    buf[p - p_start] = 0;                   // Zero terminate
}